

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_registrars.hpp
# Opt level: O0

ReporterFactory * __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory::getDescription_abi_cxx11_
          (ReporterFactory *this)

{
  ReporterFactory *this_local;
  
  XmlReporter::getDescription_abi_cxx11_();
  return this;
}

Assistant:

virtual std::string getDescription() const {
                return T::getDescription();
            }